

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_motion(_glist *x,t_floatarg xpos,t_floatarg ypos,t_floatarg fmod)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _instanceeditor *p_Var4;
  long lVar5;
  short sVar6;
  _clock *x_00;
  t_editor *ptVar7;
  t_gobj *x_01;
  t_object *x_02;
  _glist *p_Var8;
  t_glistmotionfn p_Var9;
  int in_R9D;
  float fVar10;
  undefined1 in_register_00001204 [12];
  undefined1 auVar11 [16];
  int xpos_00;
  int ypos_00;
  int x11;
  int guifsize;
  int fheight;
  int fwidth;
  undefined8 in_stack_ffffffffffffff58;
  int local_6c;
  t_floatarg local_68;
  t_floatarg tStack_64;
  undefined4 uStack_60;
  undefined1 local_58 [16];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  auVar11._4_12_ = in_register_00001204;
  auVar11._0_4_ = xpos;
  ptVar7 = x->gl_editor;
  if (ptVar7 == (t_editor *)0x0) {
    bug("editor");
    return;
  }
  uStack_60 = in_register_00001204._0_4_;
  xpos_00 = (int)xpos;
  ypos_00 = (int)ypos;
  p_Var4 = (pd_maininstance.pd_gui)->i_editor;
  *(_glist **)(p_Var4 + 0x78) = x;
  *(ulong *)(p_Var4 + 0x80) = CONCAT44(ypos_00,xpos_00);
  switch(ptVar7->field_0x88 & 7) {
  case 1:
    x_00 = ptVar7->e_clock;
    if (x_00 == (_clock *)0x0) {
      x_00 = clock_new(x,delay_move);
      x->gl_editor->e_clock = x_00;
    }
    clock_unset(x_00);
    clock_delay(x->gl_editor->e_clock,5.0);
    goto LAB_00141a06;
  case 2:
    canvas_doconnect(x,xpos_00,ypos_00,(int)fmod,0);
LAB_00141a06:
    ptVar7 = x->gl_editor;
    ptVar7->e_xnew = xpos_00;
    ptVar7->e_ynew = ypos_00;
    break;
  case 3:
    pdgui_vmess((char *)0x0,"crs iiii",x,"coords","x",(ulong)(uint)ptVar7->e_xwas,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),ptVar7->e_ywas),xpos_00,
                ypos_00);
    break;
  case 4:
    p_Var9 = ptVar7->e_motionfn;
    if (p_Var9 == (t_glistmotionfn)0x0) {
      local_68 = ypos;
      local_58 = auVar11;
      bug("e_motionfn");
      ptVar7 = x->gl_editor;
      p_Var9 = ptVar7->e_motionfn;
      auVar11 = local_58;
      ypos = local_68;
    }
    (*p_Var9)(ptVar7->e_grab,auVar11._0_4_ - (float)ptVar7->e_xwas,ypos - (float)ptVar7->e_ywas,0.0)
    ;
    ptVar7 = x->gl_editor;
    ptVar7->e_xwas = xpos_00;
    ptVar7->e_ywas = ypos_00;
    break;
  case 5:
    if (ptVar7->e_textedfor != (_rtext *)0x0) {
      rtext_mouse(ptVar7->e_textedfor,(int)(xpos - (float)ptVar7->e_xwas),
                  (int)(ypos - (float)ptVar7->e_ywas),2);
    }
    break;
  case 6:
    local_6c = 0;
    local_68 = xpos;
    tStack_64 = ypos;
    local_58 = auVar11;
    x_01 = canvas_findhitbox(x,ptVar7->e_xwas,ptVar7->e_ywas,&local_6c,&local_2c,&local_30,&local_34
                            );
    if (x_01 == (t_gobj *)0x0) break;
    fVar10 = (float)local_6c;
    x_02 = pd_checkobject(&x_01->g_pd);
    if (x_02 == (t_object *)0x0) {
LAB_00141b58:
      post("not resizable");
    }
    else {
      if (((((x_02->te_g).g_pd)->c_wb == &text_widgetbehavior) || ((~x_02->field_0x2e & 3) == 0)) ||
         ((p_Var8 = pd_checkglist((t_pd *)x_02), p_Var8 != (_glist *)0x0 &&
          ((x_02[4].te_xpix & 0x100) == 0)))) {
        fVar10 = (float)local_58._0_4_ - fVar10;
        text_getfont(x_02,x,&local_38,&local_3c,&local_40);
        lVar5 = (long)(int)fVar10 / (long)local_38;
        sVar6 = (short)lVar5;
        if ((int)lVar5 < 2) {
          sVar6 = 1;
        }
        x_02->te_width = sVar6;
        gobj_vis(x_01,x,0);
      }
      else {
        if ((x_02->te_g).g_pd != canvas_class) goto LAB_00141b58;
        gobj_vis(x_01,x,0);
        ptVar7 = x->gl_editor;
        uVar2 = ptVar7->e_xnew;
        uVar3 = ptVar7->e_ynew;
        x_02[1].te_inlet =
             (_inlet *)
             CONCAT44((int)((float)(int)((ulong)x_02[1].te_inlet >> 0x20) +
                           (tStack_64 - (float)(int)uVar3)),
                      (int)((float)(int)x_02[1].te_inlet + (local_68 - (float)(int)uVar2)));
        ptVar7->e_xnew = xpos_00;
        ptVar7->e_ynew = ypos_00;
      }
      canvas_fixlinesfor(x,x_02);
      gobj_vis(x_01,x,1);
    }
    break;
  default:
    canvas_doclick(x,xpos_00,ypos_00,(int)fmod,0,in_R9D);
  }
  puVar1 = &x->gl_editor->field_0x88;
  *puVar1 = *puVar1 | 8;
  return;
}

Assistant:

void canvas_motion(t_canvas *x, t_floatarg xpos, t_floatarg ypos,
    t_floatarg fmod)
{
#if 0
    post("motion %g %g %g", xpos, ypos, fmod);
#endif
    int mod = fmod;
    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }
    glist_setlastxy(x, xpos, ypos);
    if (x->gl_editor->e_onmotion == MA_MOVE)
    {
        if (!x->gl_editor->e_clock)
            x->gl_editor->e_clock = clock_new(x, (t_method)delay_move);
        clock_unset(x->gl_editor->e_clock);
        clock_delay(x->gl_editor->e_clock, 5);
        x->gl_editor->e_xnew = xpos;
        x->gl_editor->e_ynew = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_REGION)
        canvas_doregion(x, xpos, ypos, 0);
    else if (x->gl_editor->e_onmotion == MA_CONNECT)
    {
        canvas_doconnect(x, xpos, ypos, mod, 0);
        x->gl_editor->e_xnew = xpos;
        x->gl_editor->e_ynew = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_PASSOUT)
    {
        if (!x->gl_editor->e_motionfn)
            bug("e_motionfn");
        (*x->gl_editor->e_motionfn)(&x->gl_editor->e_grab->g_pd,
            xpos - x->gl_editor->e_xwas, ypos - x->gl_editor->e_ywas, 0);
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_DRAGTEXT)
    {
        t_rtext *rt = x->gl_editor->e_textedfor;
        if (rt)
            rtext_mouse(rt, xpos - x->gl_editor->e_xwas,
                ypos - x->gl_editor->e_ywas, RTEXT_DRAG);
    }
    else if (x->gl_editor->e_onmotion == MA_RESIZE)
    {
        int x11=0, y11=0, x12=0, y12=0;
        t_gobj *y1;
        if ((y1 = canvas_findhitbox(x,
            x->gl_editor->e_xwas, x->gl_editor->e_ywas,
                &x11, &y11, &x12, &y12)))
        {
            int wantwidth = xpos - x11;
            t_object *ob = pd_checkobject(&y1->g_pd);
            if (ob && ((ob->te_pd->c_wb == &text_widgetbehavior) ||
                ob->te_type == T_ATOM ||
                    (pd_checkglist(&ob->te_pd) &&
                     !((t_canvas *)ob)->gl_isgraph)))
            {
                int fwidth, fheight, guifsize;
                text_getfont(ob, x, &fwidth, &fheight, &guifsize);
                wantwidth = wantwidth / fwidth;
                if (wantwidth < 1)
                    wantwidth = 1;
                ob->te_width = wantwidth;
                gobj_vis(y1, x, 0);
                canvas_fixlinesfor(x, ob);
                gobj_vis(y1, x, 1);
            }
            else if (ob && ob->ob_pd == canvas_class)
            {
                gobj_vis(y1, x, 0);
                ((t_canvas *)ob)->gl_pixwidth += xpos - x->gl_editor->e_xnew;
                ((t_canvas *)ob)->gl_pixheight += ypos - x->gl_editor->e_ynew;
                x->gl_editor->e_xnew = xpos;
                x->gl_editor->e_ynew = ypos;
                canvas_fixlinesfor(x, ob);
                gobj_vis(y1, x, 1);
            }
            else post("not resizable");
        }
    }
    else canvas_doclick(x, xpos, ypos, 0, mod, 0);

    x->gl_editor->e_lastmoved = 1;
}